

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_PreserveNewlinesThroughEmits_Test::
~PrinterTest_PreserveNewlinesThroughEmits_Test(PrinterTest_PreserveNewlinesThroughEmits_Test *this)

{
  PrinterTest_PreserveNewlinesThroughEmits_Test *this_local;
  
  ~PrinterTest_PreserveNewlinesThroughEmits_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(PrinterTest, PreserveNewlinesThroughEmits) {
  {
    Printer printer(output());
    const std::vector<std::string> insertion_lines = {"// line 1", "// line 2"};
    printer.Emit(
        {
            {"insert_lines",
             [&] {
               for (const auto& line : insertion_lines) {
                 printer.Emit({{"line", line}}, R"cc(
                   $line$
                 )cc");
               }
             }},
        },
        R"cc(
          // one
          // two

          $insert_lines$;

          // three
          // four
        )cc");
  }
  EXPECT_EQ(written(),
            "// one\n"
            "// two\n"
            "\n"
            "// line 1\n"
            "// line 2\n"
            "\n"
            "// three\n"
            "// four\n");
}